

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.h
# Opt level: O2

bool __thiscall JetHead::Path::append(Path *this,char *path)

{
  undefined1 uVar1;
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,path,&local_31);
  uVar1 = JetHead::Path::append((string *)this);
  std::__cxx11::string::~string(local_30);
  return (bool)uVar1;
}

Assistant:

bool append( const char *path ) { return append( JHSTD::string( path ) ); }